

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UniValue * __thiscall
RPCHelpMan::HandleRequest(UniValue *__return_storage_ptr__,RPCHelpMan *this,JSONRPCRequest *request)

{
  long lVar1;
  RPCResult *pRVar2;
  string str;
  string key;
  string str_00;
  UniValue val;
  UniValue val_00;
  bool bVar3;
  const_reference this_00;
  UniValue *request_00;
  UniValue *pUVar4;
  runtime_error *prVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong __n;
  vector<RPCArg,_std::allocator<RPCArg>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  RPCResult *this_02;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd58;
  RPCHelpMan *fmt;
  vector<RPCArg,_std::allocator<RPCArg>_> *pvVar6;
  undefined1 auVar7 [32];
  undefined1 in_stack_fffffffffffffd70 [48];
  undefined1 in_stack_fffffffffffffda0 [32];
  UniValue match_1;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [16];
  UniValue local_180;
  string local_128;
  UniValue match;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [16];
  UniValue arg_mismatch;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (request->mode == GET_ARGS) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      GetArgMap(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
  }
  else if ((request->mode == GET_HELP) ||
          (bVar3 = IsValidNumArgs(this,((long)(request->params).values.
                                              super__Vector_base<UniValue,_std::allocator<UniValue>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(request->params).values.
                                             super__Vector_base<UniValue,_std::allocator<UniValue>_>
                                             ._M_impl.super__Vector_impl_data._M_start) / 0x58),
          !bVar3)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    ToString_abi_cxx11_((string *)&arg_mismatch,this);
    std::runtime_error::runtime_error(prVar5,(string *)&arg_mismatch);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    pUVar4 = &request->params;
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = 0;
    str._M_string_length = (size_type)__return_storage_ptr__;
    str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd48;
    str.field_2._M_allocated_capacity = in_stack_fffffffffffffd58;
    str.field_2._8_8_ = request;
    UniValue::UniValue(&arg_mismatch,VOBJ,str);
    std::__cxx11::string::~string((string *)&local_b0);
    this_01 = &this->m_args;
    pvVar6 = this_01;
    for (__n = 0; __n < (ulong)(((long)(this->m_args).
                                       super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->m_args).
                                      super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                                      super__Vector_impl_data._M_start) / 0x108); __n = __n + 1) {
      this_00 = std::vector<RPCArg,_std::allocator<RPCArg>_>::at(this_01,__n);
      request_00 = UniValue::operator[](pUVar4,__n);
      RPCArg::MatchesType(&match,this_00,request_00);
      bVar3 = UniValue::isTrue(&match);
      if (!bVar3) {
        match_1._0_8_ = __n + 1;
        tinyformat::format<unsigned_long,std::__cxx11::string>
                  (&local_128,(tinyformat *)"Position %s (%s)",(char *)&match_1,
                   (unsigned_long *)this_00,in_R8);
        UniValue::UniValue(&local_180,&match);
        key._M_string_length = (size_type)__return_storage_ptr__;
        key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd48;
        key.field_2._M_allocated_capacity = (size_type)this;
        key.field_2._8_8_ = request;
        auVar7 = in_stack_fffffffffffffd70._0_32_;
        val_00.val._M_dataplus._M_p = (pointer)auVar7._0_8_;
        val_00.val._M_string_length = auVar7._8_8_;
        val_00.val.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )auVar7._16_16_;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70._32_8_;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd70._40_8_;
        val_00._0_8_ = pvVar6;
        val_00.keys.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)in_stack_fffffffffffffda0._0_8_;
        val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data =
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)
             (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffda0._8_24_;
        UniValue::pushKV(&arg_mismatch,key,val_00);
        UniValue::~UniValue(&local_180);
        this_01 = pvVar6;
        std::__cxx11::string::~string((string *)&local_128);
        pvVar6 = this_01;
      }
      UniValue::~UniValue(&match);
    }
    if (arg_mismatch.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        arg_mismatch.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
        super__Vector_impl_data._M_start) {
      match.typ = CONCAT31(match.typ._1_3_,this->m_req == (JSONRPCRequest *)0x0);
      fmt = this;
      inline_check_non_fatal<bool>
                ((bool *)&match,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                 ,0x298,"HandleRequest","m_req == nullptr");
      this->m_req = request;
      std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::operator()
                (__return_storage_ptr__,&this->m_fun,this,request);
      this->m_req = (JSONRPCRequest *)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&match,"-rpcdoccheck",(allocator<char> *)&match_1);
      bVar3 = ArgsManager::GetBoolArg(&gArgs,(string *)&match,false);
      std::__cxx11::string::~string((string *)&match);
      if (bVar3) {
        local_1a0 = local_190;
        local_198 = 0;
        local_190[0] = 0;
        pUVar4 = &match;
        str_00._M_string_length = (size_type)__return_storage_ptr__;
        str_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd48;
        str_00.field_2._M_allocated_capacity = (size_type)fmt;
        str_00.field_2._8_8_ = request;
        UniValue::UniValue(pUVar4,VARR,str_00);
        std::__cxx11::string::~string((string *)&local_1a0);
        this_02 = (this->m_results).m_results.
                  super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pRVar2 = (this->m_results).m_results.
                 super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        do {
          if (this_02 == pRVar2) break;
          RPCResult::MatchesType(&match_1,this_02,__return_storage_ptr__);
          bVar3 = UniValue::isTrue(&match_1);
          if (bVar3) {
            UniValue::setNull(pUVar4);
          }
          else {
            UniValue::UniValue((UniValue *)&stack0xfffffffffffffdb0,&match_1);
            val.val._M_dataplus._M_p = (pointer)__return_storage_ptr__;
            val._0_8_ = in_stack_fffffffffffffd48;
            val.val._M_string_length = (size_type)fmt;
            val.val.field_2._M_allocated_capacity = (size_type)request;
            val.val.field_2._8_8_ = pvVar6;
            val.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data =
                 (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )in_stack_fffffffffffffd70._0_24_;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data =
                 (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                 (_Vector_base<UniValue,_std::allocator<UniValue>_>)
                 in_stack_fffffffffffffd70._24_24_;
            UniValue::push_back(pUVar4,val);
            UniValue::~UniValue((UniValue *)&stack0xfffffffffffffdb0);
          }
          UniValue::~UniValue(&match_1);
          this_02 = this_02 + 1;
        } while (!bVar3);
        if (match.typ != VNULL) {
          if (match.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              match.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&match_1,"no possible results defined",
                       (allocator<char> *)&stack0xfffffffffffffd90);
          }
          else {
            if ((long)match.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)match.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x58) {
              pUVar4 = UniValue::operator[](&match,0);
            }
            UniValue::write_abi_cxx11_(&match_1,(int)pUVar4,(void *)0x4,0);
          }
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          FormatFullVersion_abi_cxx11_();
          tinyformat::
          format<std::__cxx11::string,std::__cxx11::string,char[13],std::__cxx11::string,char[42]>
                    ((string *)&stack0xfffffffffffffd90,
                     (tinyformat *)
                     "Internal bug detected: RPC call \"%s\" returned incorrect type:\n%s\n%s %s\nPlease report this issue here: %s\n"
                     ,(char *)fmt,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&match_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Bitcoin Core",(char (*) [13])&stack0xfffffffffffffd70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "https://github.com/bitcoin/bitcoin/issues",
                     (char (*) [42])__return_storage_ptr__);
          std::runtime_error::runtime_error(prVar5,(string *)&stack0xfffffffffffffd90);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_002fe10a;
        }
        UniValue::~UniValue(&match);
      }
      UniValue::~UniValue(&arg_mismatch);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
    }
    else {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      UniValue::write_abi_cxx11_(&match_1,(int)&arg_mismatch,(void *)0x4,0);
      tinyformat::format<std::__cxx11::string>
                ((string *)&match,(tinyformat *)"Wrong type passed:\n%s",(char *)&match_1,args);
      JSONRPCError(pUVar4,-3,(string *)&match);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
LAB_002fe10a:
  __stack_chk_fail();
}

Assistant:

UniValue RPCHelpMan::HandleRequest(const JSONRPCRequest& request) const
{
    if (request.mode == JSONRPCRequest::GET_ARGS) {
        return GetArgMap();
    }
    /*
     * Check if the given request is valid according to this command or if
     * the user is asking for help information, and throw help when appropriate.
     */
    if (request.mode == JSONRPCRequest::GET_HELP || !IsValidNumArgs(request.params.size())) {
        throw std::runtime_error(ToString());
    }
    UniValue arg_mismatch{UniValue::VOBJ};
    for (size_t i{0}; i < m_args.size(); ++i) {
        const auto& arg{m_args.at(i)};
        UniValue match{arg.MatchesType(request.params[i])};
        if (!match.isTrue()) {
            arg_mismatch.pushKV(strprintf("Position %s (%s)", i + 1, arg.m_names), std::move(match));
        }
    }
    if (!arg_mismatch.empty()) {
        throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Wrong type passed:\n%s", arg_mismatch.write(4)));
    }
    CHECK_NONFATAL(m_req == nullptr);
    m_req = &request;
    UniValue ret = m_fun(*this, request);
    m_req = nullptr;
    if (gArgs.GetBoolArg("-rpcdoccheck", DEFAULT_RPC_DOC_CHECK)) {
        UniValue mismatch{UniValue::VARR};
        for (const auto& res : m_results.m_results) {
            UniValue match{res.MatchesType(ret)};
            if (match.isTrue()) {
                mismatch.setNull();
                break;
            }
            mismatch.push_back(std::move(match));
        }
        if (!mismatch.isNull()) {
            std::string explain{
                mismatch.empty() ? "no possible results defined" :
                mismatch.size() == 1 ? mismatch[0].write(4) :
                mismatch.write(4)};
            throw std::runtime_error{
                strprintf("Internal bug detected: RPC call \"%s\" returned incorrect type:\n%s\n%s %s\nPlease report this issue here: %s\n",
                          m_name, explain,
                          PACKAGE_NAME, FormatFullVersion(),
                          PACKAGE_BUGREPORT)};
        }
    }
    return ret;
}